

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11fwd.c
# Opt level: O1

void x11_send_eof(Channel *chan)

{
  long lVar1;
  ChannelVtable *pCVar2;
  
  if (chan->vt != &X11Connection_channelvt) {
    __assert_fail("chan->vt == &X11Connection_channelvt",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/x11fwd.c",
                  0x26a,"void x11_send_eof(Channel *)");
  }
  pCVar2 = chan[-1].vt;
  lVar1 = 0x20;
  if (pCVar2 == (ChannelVtable *)0x0) {
    pCVar2 = *(ChannelVtable **)&chan[-2].initial_fixed_window_size;
    lVar1 = 8;
    if (pCVar2 == (ChannelVtable *)0x0) {
      return;
    }
  }
  (**(code **)(pCVar2->free + lVar1))();
  return;
}

Assistant:

static void x11_send_eof(Channel *chan)
{
    assert(chan->vt == &X11Connection_channelvt);
    X11Connection *xconn = container_of(chan, X11Connection, chan);

    if (xconn->s) {
        sk_write_eof(xconn->s);
    } else {
        /*
         * If EOF is received from the X client before we've got to
         * the point of actually connecting to an X server, then we
         * should send an EOF back to the client so that the
         * forwarded channel will be terminated.
         */
        if (xconn->c)
            sshfwd_write_eof(xconn->c);
    }
}